

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  LIBSSH2_SESSION *session;
  bool bVar1;
  int iVar2;
  uint uVar3;
  time_t start_time;
  uchar **unaff_RBP;
  uchar *local_48;
  size_t local_40;
  char *local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_38 = signame;
    start_time = time((time_t *)0x0);
    local_40 = signame_len;
    do {
      session = channel->session;
      if (channel->sendsignal_state == libssh2_NB_state_idle) {
        channel->sendsignal_packet_len = signame_len + 0x14;
        local_48 = (uchar *)(*session->alloc)(signame_len + 0x14,&session->abstract);
        channel->sendsignal_packet = local_48;
        if (local_48 != (uchar *)0x0) {
          *local_48 = 'b';
          local_48 = local_48 + 1;
          _libssh2_store_u32(&local_48,(channel->remote).id);
          _libssh2_store_str(&local_48,"signal",6);
          *local_48 = '\0';
          local_48 = local_48 + 1;
          _libssh2_store_str(&local_48,local_38,local_40);
          channel->sendsignal_state = libssh2_NB_state_created;
          unaff_RBP = &local_48;
          goto LAB_0010cbae;
        }
        uVar3 = _libssh2_error(session,-6,"Unable to allocate memory for signal request");
        unaff_RBP = (uchar **)(ulong)uVar3;
      }
      else {
LAB_0010cbae:
        uVar3 = 0xfffffff2;
        if (channel->sendsignal_state == libssh2_NB_state_created) {
          iVar2 = _libssh2_transport_send
                            (session,channel->sendsignal_packet,channel->sendsignal_packet_len,
                             (uchar *)0x0,0);
          if (iVar2 == 0) {
            (*session->free)(channel->sendsignal_packet,&session->abstract);
            bVar1 = true;
            uVar3 = 0;
          }
          else {
            if (iVar2 == -0x25) {
              unaff_RBP = (uchar **)0xffffffdb;
              _libssh2_error(session,-0x25,"Would block sending signal request");
            }
            else {
              (*session->free)(channel->sendsignal_packet,&session->abstract);
              channel->sendsignal_state = libssh2_NB_state_idle;
              uVar3 = _libssh2_error(session,iVar2,"Unable to send signal packet");
              unaff_RBP = (uchar **)(ulong)uVar3;
            }
            uVar3 = 0xfffffff2;
            bVar1 = false;
          }
          if (!bVar1) goto LAB_0010cc5a;
        }
        channel->sendsignal_state = libssh2_NB_state_idle;
        unaff_RBP = (uchar **)(ulong)uVar3;
      }
LAB_0010cc5a:
      if ((int)unaff_RBP != -0x25) {
        return (int)unaff_RBP;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_signal(channel, signame, signame_len));
    return rc;
}